

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

void Logger::clear(void)

{
  std::vector<Logger::QueueEntry,_std::allocator<Logger::QueueEntry>_>::clear(&queue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&errors_abi_cxx11_);
  error = false;
  fatalError = false;
  errorOnWarning = false;
  silent = false;
  return;
}

Assistant:

void Logger::clear()
{
	queue.clear();
	errors.clear();
	error = false;
	fatalError = false;
	errorOnWarning = false;
	silent = false;
}